

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::insert
          (array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
           *this,CString *item,range r)

{
  CString *pCVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int new_len;
  
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar3 = (int)((long)r.begin - (long)this->list >> 3) * -0x55555555;
    uVar2 = this->list_size;
    uVar5 = this->num_elements;
    if (uVar5 == uVar2) {
      uVar2 = 1;
      if (1 < (int)uVar5) {
        uVar2 = uVar5 >> 1;
      }
      alloc(this,uVar2 + uVar5);
      uVar2 = this->list_size;
      uVar5 = this->num_elements;
    }
    new_len = uVar5 + 1;
    if ((int)uVar2 <= (int)uVar5) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar3 < (int)uVar5) {
      lVar6 = (long)(int)uVar5;
      lVar4 = lVar6 * 0x18 + 8;
      do {
        pCVar1 = this->list;
        *(undefined8 *)((long)pCVar1 + lVar4 + -8) = *(undefined8 *)(pCVar1 + (long)new_len + -2);
        string_base<allocator_default<char>_>::operator=
                  ((string_base<allocator_default<char>_> *)((long)&pCVar1->m_Hash + lVar4),
                   &pCVar1[(long)new_len + -2].m_Replacement);
        lVar6 = lVar6 + -1;
        new_len = new_len + -1;
        lVar4 = lVar4 + -0x18;
      } while (iVar3 < lVar6);
    }
    uVar2 = item->m_ContextHash;
    pCVar1 = this->list + iVar3;
    pCVar1->m_Hash = item->m_Hash;
    pCVar1->m_ContextHash = uVar2;
    string_base<allocator_default<char>_>::operator=(&pCVar1->m_Replacement,&item->m_Replacement);
    return this->num_elements + -1;
  }
  iVar3 = add(this,item);
  return iVar3;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}